

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O0

void __thiscall interfaces_tests::findBlock::test_method(findBlock *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  pointer pCVar4;
  FoundBlock *pFVar5;
  CBlockIndex *pCVar6;
  time_t tVar7;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffecd8;
  CBlock *in_stack_ffffffffffffece0;
  char *in_stack_ffffffffffffece8;
  CChain *in_stack_ffffffffffffecf0;
  undefined4 in_stack_ffffffffffffecf8;
  int in_stack_ffffffffffffecfc;
  undefined7 in_stack_ffffffffffffed00;
  undefined1 in_stack_ffffffffffffed07;
  lazy_ostream *in_stack_ffffffffffffed08;
  const_string *in_stack_ffffffffffffed10;
  undefined7 in_stack_ffffffffffffed18;
  undefined1 in_stack_ffffffffffffed1f;
  CChain *active;
  unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *chain;
  findBlock *this_local;
  const_string local_eb8 [2];
  lazy_ostream local_e98 [2];
  assertion_result local_e78 [2];
  const_string local_e40 [2];
  lazy_ostream local_e20 [2];
  assertion_result local_e00 [2];
  const_string local_dc8 [2];
  lazy_ostream local_da8 [2];
  assertion_result local_d88 [2];
  const_string local_d50 [2];
  lazy_ostream local_d30 [2];
  assertion_result local_d10 [2];
  undefined1 local_cd8 [16];
  undefined1 local_cc8 [64];
  const_string local_c88 [2];
  lazy_ostream local_c68 [2];
  assertion_result local_c48 [2];
  const_string local_c10 [2];
  lazy_ostream local_bf0 [2];
  assertion_result local_bd0 [2];
  const_string local_b98 [2];
  lazy_ostream local_b78 [2];
  assertion_result local_b58 [2];
  undefined1 local_b20 [94];
  bool next_active;
  bool cur_active;
  pointer local_ac0;
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [64];
  const_string local_a68 [2];
  lazy_ostream local_a48 [2];
  assertion_result local_a28 [2];
  int64_t mtp_time;
  undefined1 local_9e8 [120];
  lazy_ostream local_970 [2];
  assertion_result local_950 [2];
  int64_t max_time;
  undefined1 local_910 [120];
  lazy_ostream local_898 [2];
  assertion_result local_878 [2];
  int64_t time;
  undefined1 local_838 [16];
  undefined1 local_828 [64];
  const_string local_7e8 [2];
  lazy_ostream local_7c8 [2];
  assertion_result local_7a8 [2];
  undefined1 local_770 [16];
  undefined1 local_760 [64];
  const_string local_720 [2];
  lazy_ostream local_700 [2];
  assertion_result local_6e0 [2];
  int height;
  undefined1 local_6a0 [16];
  undefined1 local_690 [64];
  const_string local_650 [2];
  lazy_ostream local_630 [2];
  assertion_result local_610 [2];
  const_string local_5d8;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  FoundBlock local_3a8;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_238 [32];
  uint256 next_hash;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [96];
  CBlock data;
  undefined1 local_88 [32];
  uint256 hash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
             (char *)in_stack_ffffffffffffed10,(int)((ulong)in_stack_ffffffffffffed08 >> 0x20),
             (char *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00),
             (char *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffecd8);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_ffffffffffffecd8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffecd8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffed10,
             (char *)in_stack_ffffffffffffed08,
             (char *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00),
             in_stack_ffffffffffffecfc,SUB41((uint)in_stack_ffffffffffffecf8 >> 0x18,0));
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
             (char *)in_stack_ffffffffffffed10,(int)((ulong)in_stack_ffffffffffffed08 >> 0x20),
             (char *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00),
             (char *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffecd8);
  ChainstateManager::ActiveChain((ChainstateManager *)in_stack_ffffffffffffecd8);
  uint256::uint256((uint256 *)in_stack_ffffffffffffecd8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    pCVar4 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffece8);
    local_278 = 0;
    uStack_270 = 0;
    local_288 = 0;
    uStack_280 = 0;
    local_298 = 0;
    uStack_290 = 0;
    local_2a8 = 0;
    uStack_2a0 = 0;
    local_2b8 = 0;
    uStack_2b0 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_ffffffffffffecd8);
    pFVar5 = interfaces::FoundBlock::hash
                       ((FoundBlock *)in_stack_ffffffffffffece8,(uint256 *)in_stack_ffffffffffffece0
                       );
    (*pCVar4->_vptr_Chain[10])(pCVar4,&stack0xffffffffffffffb8,pFVar5);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_610,local_630,local_650,0x19,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,(char (*) [1])in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffece8);
    in_stack_ffffffffffffece8 = "active[10]->GetBlockHash()";
    in_stack_ffffffffffffece0 = (CBlock *)&stack0xffffffffffffff98;
    in_stack_ffffffffffffecd8 = "hash";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_690,local_6a0,0x1a,1,2,&hash);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  height = -1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    pCVar4 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffece8);
    local_2c8 = 0;
    uStack_2c0 = 0;
    local_2d8 = 0;
    uStack_2d0 = 0;
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_2f8 = 0;
    uStack_2f0 = 0;
    local_308 = 0;
    uStack_300 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_ffffffffffffecd8);
    pFVar5 = interfaces::FoundBlock::height
                       ((FoundBlock *)in_stack_ffffffffffffece8,(int *)in_stack_ffffffffffffece0);
    (*pCVar4->_vptr_Chain[10])(pCVar4,local_88,pFVar5);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6e0,local_700,local_720,0x1d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,(char (*) [1])in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    pCVar6 = CChain::operator[](in_stack_ffffffffffffecf0,
                                (int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    in_stack_ffffffffffffece0 = (CBlock *)&pCVar6->nHeight;
    in_stack_ffffffffffffece8 = "active[20]->nHeight";
    in_stack_ffffffffffffecd8 = "height";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_760,local_770,0x1e,1,2,&height);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CBlock::CBlock((CBlock *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    pCVar4 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffece8);
    local_318 = 0;
    uStack_310 = 0;
    local_328 = 0;
    uStack_320 = 0;
    local_338 = 0;
    uStack_330 = 0;
    local_348 = 0;
    uStack_340 = 0;
    local_358 = 0;
    uStack_350 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_ffffffffffffecd8);
    pFVar5 = interfaces::FoundBlock::data
                       ((FoundBlock *)in_stack_ffffffffffffece8,in_stack_ffffffffffffece0);
    (*pCVar4->_vptr_Chain[10])(pCVar4,local_158 + 0x40,pFVar5);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7a8,local_7c8,local_7e8,0x21,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,(char (*) [1])in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffece8);
    in_stack_ffffffffffffece8 = "active[30]->GetBlockHash()";
    in_stack_ffffffffffffece0 = (CBlock *)local_158;
    in_stack_ffffffffffffecd8 = "data.GetHash()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_828,local_838,0x22,1,2,local_158 + 0x20);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  time = -1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    pCVar4 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffece8);
    local_3a8.m_data = (CBlock *)0x0;
    local_3a8.found = false;
    local_3a8._73_7_ = 0;
    local_3a8.m_locator = (CBlockLocator *)0x0;
    local_3a8.m_next_block = (FoundBlock *)0x0;
    local_3a8.m_mtp_time = (int64_t *)0x0;
    local_3a8.m_in_active_chain = (bool *)0x0;
    local_3a8.m_time = (int64_t *)0x0;
    local_3a8.m_max_time = (int64_t *)0x0;
    local_3a8.m_hash = (uint256 *)0x0;
    local_3a8.m_height = (int *)0x0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_ffffffffffffecd8);
    tVar7 = interfaces::FoundBlock::time(&local_3a8,&time);
    (*pCVar4->_vptr_Chain[10])(pCVar4,local_178,tVar7);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_878,local_898,(const_string *)(local_910 + 0x58),0x25,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,(char (*) [1])in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    local_910._0_8_ = CBlockIndex::GetBlockTime((CBlockIndex *)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffece8 = "active[40]->GetBlockTime()";
    in_stack_ffffffffffffece0 = (CBlock *)local_910;
    in_stack_ffffffffffffecd8 = "time";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_910 + 0x18,local_910 + 8,0x26,1,2,&time);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  max_time = -1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    pCVar4 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffece8);
    local_3b8 = 0;
    uStack_3b0 = 0;
    local_3c8 = 0;
    uStack_3c0 = 0;
    local_3d8 = 0;
    uStack_3d0 = 0;
    local_3e8 = 0;
    uStack_3e0 = 0;
    local_3f8 = 0;
    uStack_3f0 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_ffffffffffffecd8);
    pFVar5 = interfaces::FoundBlock::maxTime
                       ((FoundBlock *)in_stack_ffffffffffffece8,(int64_t *)in_stack_ffffffffffffece0
                       );
    (*pCVar4->_vptr_Chain[10])(pCVar4,local_198,pFVar5);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_950,local_970,(const_string *)(local_9e8 + 0x58),0x29,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,(char (*) [1])in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    local_9e8._0_8_ = CBlockIndex::GetBlockTimeMax((CBlockIndex *)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffece8 = "active[50]->GetBlockTimeMax()";
    in_stack_ffffffffffffece0 = (CBlock *)local_9e8;
    in_stack_ffffffffffffecd8 = "max_time";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_9e8 + 0x18,local_9e8 + 8,0x2a,1,2,&max_time);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  mtp_time = -1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    pCVar4 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffece8);
    local_408 = 0;
    uStack_400 = 0;
    local_418 = 0;
    uStack_410 = 0;
    local_428 = 0;
    uStack_420 = 0;
    local_438 = 0;
    uStack_430 = 0;
    local_448 = 0;
    uStack_440 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_ffffffffffffecd8);
    pFVar5 = interfaces::FoundBlock::mtpTime
                       ((FoundBlock *)in_stack_ffffffffffffece8,(int64_t *)in_stack_ffffffffffffece0
                       );
    (*pCVar4->_vptr_Chain[10])(pCVar4,&stack0xfffffffffffffe48,pFVar5);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a28,local_a48,local_a68,0x2d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,(char (*) [1])in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    local_ac0 = (pointer)CBlockIndex::GetMedianTimePast
                                   ((CBlockIndex *)
                                    CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
    in_stack_ffffffffffffece8 = "active[60]->GetMedianTimePast()";
    in_stack_ffffffffffffece0 = (CBlock *)&local_ac0;
    in_stack_ffffffffffffecd8 = "mtp_time";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_aa8,local_ab8,0x2e,1,2,&mtp_time);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  cur_active = false;
  next_active = false;
  uint256::uint256((uint256 *)in_stack_ffffffffffffecd8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,(char (*) [1])in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    local_b20._4_4_ = CChain::Height((CChain *)in_stack_ffffffffffffecd8);
    local_b20._0_4_ = 100;
    in_stack_ffffffffffffece8 = "100";
    in_stack_ffffffffffffece0 = (CBlock *)local_b20;
    in_stack_ffffffffffffecd8 = "active.Height()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_b20 + 0x18,local_b20 + 8,0x32,1,2,local_b20 + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    pCVar4 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffece8);
    local_458 = 0;
    uStack_450 = 0;
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_488 = 0;
    uStack_480 = 0;
    local_498 = 0;
    uStack_490 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_ffffffffffffecd8);
    interfaces::FoundBlock::inActiveChain
              ((FoundBlock *)in_stack_ffffffffffffece8,(bool *)in_stack_ffffffffffffece0);
    local_4a8 = 0;
    uStack_4a0 = 0;
    local_4b8 = 0;
    uStack_4b0 = 0;
    local_4c8 = 0;
    uStack_4c0 = 0;
    local_4d8 = 0;
    uStack_4d0 = 0;
    local_4e8 = 0;
    uStack_4e0 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_ffffffffffffecd8);
    interfaces::FoundBlock::inActiveChain
              ((FoundBlock *)in_stack_ffffffffffffece8,(bool *)in_stack_ffffffffffffece0);
    interfaces::FoundBlock::hash
              ((FoundBlock *)in_stack_ffffffffffffece8,(uint256 *)in_stack_ffffffffffffece0);
    pFVar5 = interfaces::FoundBlock::nextBlock
                       ((FoundBlock *)in_stack_ffffffffffffece8,
                        (FoundBlock *)in_stack_ffffffffffffece0);
    (*pCVar4->_vptr_Chain[10])(pCVar4,&stack0xfffffffffffffe08,pFVar5);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b58,local_b78,local_b98,0x33,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_bd0,local_bf0,local_c10,0x34,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c48,local_c68,local_c88,0x35,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,(char (*) [1])in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffece8);
    in_stack_ffffffffffffece8 = "active[100]->GetBlockHash()";
    in_stack_ffffffffffffece0 = (CBlock *)&stack0xfffffffffffffde8;
    in_stack_ffffffffffffecd8 = "next_hash";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_cc8,local_cd8,0x36,1,2,&next_hash);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  next_active = false;
  cur_active = false;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    pCVar4 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_ffffffffffffecd8);
    CChain::operator[](in_stack_ffffffffffffecf0,(int)((ulong)in_stack_ffffffffffffece8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffece8);
    local_4f8 = 0;
    uStack_4f0 = 0;
    local_508 = 0;
    uStack_500 = 0;
    local_518 = 0;
    uStack_510 = 0;
    local_528 = 0;
    uStack_520 = 0;
    local_538 = 0;
    uStack_530 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_ffffffffffffecd8);
    interfaces::FoundBlock::inActiveChain
              ((FoundBlock *)in_stack_ffffffffffffece8,(bool *)in_stack_ffffffffffffece0);
    local_548 = 0;
    uStack_540 = 0;
    local_558 = 0;
    uStack_550 = 0;
    local_568 = 0;
    uStack_560 = 0;
    local_578 = 0;
    uStack_570 = 0;
    local_588 = 0;
    uStack_580 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_ffffffffffffecd8);
    interfaces::FoundBlock::inActiveChain
              ((FoundBlock *)in_stack_ffffffffffffece8,(bool *)in_stack_ffffffffffffece0);
    pFVar5 = interfaces::FoundBlock::nextBlock
                       ((FoundBlock *)in_stack_ffffffffffffece8,
                        (FoundBlock *)in_stack_ffffffffffffece0);
    (*pCVar4->_vptr_Chain[10])(pCVar4,local_238,pFVar5);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d10,local_d30,local_d50,0x38,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d88,local_da8,local_dc8,0x39,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e00,local_e20,local_e40,0x3a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffed1f,in_stack_ffffffffffffed18),
               in_stack_ffffffffffffed10,(size_t)in_stack_ffffffffffffed08,
               (const_string *)CONCAT17(in_stack_ffffffffffffed07,in_stack_ffffffffffffed00));
    pCVar4 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_ffffffffffffecd8);
    local_248 = 0;
    uStack_240 = 0;
    local_258 = 0;
    uStack_250 = 0;
    uint256::uint256((uint256 *)in_stack_ffffffffffffecd8);
    local_598 = 0;
    uStack_590 = 0;
    local_5a8 = 0;
    uStack_5a0 = 0;
    local_5b8 = 0;
    uStack_5b0 = 0;
    local_5c8 = 0;
    uStack_5c0 = 0;
    local_5d8.m_begin = (iterator)0x0;
    local_5d8.m_end = (iterator)0x0;
    in_stack_ffffffffffffed10 = &local_5d8;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_ffffffffffffecd8);
    iVar3 = (*pCVar4->_vptr_Chain[10])(pCVar4,&local_258,in_stack_ffffffffffffed10);
    in_stack_ffffffffffffed1f = (undefined1)iVar3;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffece8,
               SUB81((ulong)in_stack_ffffffffffffece0 >> 0x38,0));
    in_stack_ffffffffffffed08 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffece0,
               (basic_cstring<const_char> *)in_stack_ffffffffffffecd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffece8,
               (pointer)in_stack_ffffffffffffece0,(unsigned_long)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffecd8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e78,local_e98,local_eb8,0x3c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffecd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffecd8);
    in_stack_ffffffffffffed07 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffed07);
  CBlock::~CBlock((CBlock *)in_stack_ffffffffffffecd8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffecd8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(findBlock)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();

    uint256 hash;
    BOOST_CHECK(chain->findBlock(active[10]->GetBlockHash(), FoundBlock().hash(hash)));
    BOOST_CHECK_EQUAL(hash, active[10]->GetBlockHash());

    int height = -1;
    BOOST_CHECK(chain->findBlock(active[20]->GetBlockHash(), FoundBlock().height(height)));
    BOOST_CHECK_EQUAL(height, active[20]->nHeight);

    CBlock data;
    BOOST_CHECK(chain->findBlock(active[30]->GetBlockHash(), FoundBlock().data(data)));
    BOOST_CHECK_EQUAL(data.GetHash(), active[30]->GetBlockHash());

    int64_t time = -1;
    BOOST_CHECK(chain->findBlock(active[40]->GetBlockHash(), FoundBlock().time(time)));
    BOOST_CHECK_EQUAL(time, active[40]->GetBlockTime());

    int64_t max_time = -1;
    BOOST_CHECK(chain->findBlock(active[50]->GetBlockHash(), FoundBlock().maxTime(max_time)));
    BOOST_CHECK_EQUAL(max_time, active[50]->GetBlockTimeMax());

    int64_t mtp_time = -1;
    BOOST_CHECK(chain->findBlock(active[60]->GetBlockHash(), FoundBlock().mtpTime(mtp_time)));
    BOOST_CHECK_EQUAL(mtp_time, active[60]->GetMedianTimePast());

    bool cur_active{false}, next_active{false};
    uint256 next_hash;
    BOOST_CHECK_EQUAL(active.Height(), 100);
    BOOST_CHECK(chain->findBlock(active[99]->GetBlockHash(), FoundBlock().inActiveChain(cur_active).nextBlock(FoundBlock().inActiveChain(next_active).hash(next_hash))));
    BOOST_CHECK(cur_active);
    BOOST_CHECK(next_active);
    BOOST_CHECK_EQUAL(next_hash, active[100]->GetBlockHash());
    cur_active = next_active = false;
    BOOST_CHECK(chain->findBlock(active[100]->GetBlockHash(), FoundBlock().inActiveChain(cur_active).nextBlock(FoundBlock().inActiveChain(next_active))));
    BOOST_CHECK(cur_active);
    BOOST_CHECK(!next_active);

    BOOST_CHECK(!chain->findBlock({}, FoundBlock()));
}